

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O0

int kws_search_step(ps_search_t *search,int frame_idx)

{
  acmod_t *acmod_00;
  int16 *senscr_00;
  acmod_t *acmod;
  kws_search_t *kwss;
  int16 *senscr;
  ps_search_t *ppStack_10;
  int frame_idx_local;
  ps_search_t *search_local;
  
  acmod_00 = search->acmod;
  senscr._4_4_ = frame_idx;
  ppStack_10 = search;
  if (acmod_00->compallsen == '\0') {
    kws_search_sen_active((kws_search_t *)search);
  }
  senscr_00 = acmod_score(acmod_00,(int *)((long)&senscr + 4));
  kws_search_hmm_eval((kws_search_t *)search,senscr_00);
  kws_search_hmm_prune((kws_search_t *)search);
  kws_search_trans((kws_search_t *)search);
  *(int *)&search[1].pls = *(int *)&search[1].pls + 1;
  return 0;
}

Assistant:

int
kws_search_step(ps_search_t * search, int frame_idx)
{
    int16 const *senscr;
    kws_search_t *kwss = (kws_search_t *) search;
    acmod_t *acmod = search->acmod;

    /* Activate senones */
    if (!acmod->compallsen)
        kws_search_sen_active(kwss);

    /* Calculate senone scores for current frame. */
    senscr = acmod_score(acmod, &frame_idx);

    /* Evaluate hmms in phone loop and in active keyphrase nodes */
    kws_search_hmm_eval(kwss, senscr);

    /* Prune hmms with low prob */
    kws_search_hmm_prune(kwss);

    /* Do hmms transitions */
    kws_search_trans(kwss);

    ++kwss->frame;
    return 0;
}